

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeSortAllocUnpacked(SortSubtask *pTask)

{
  UnpackedRecord *pUVar1;
  int iVar2;
  
  iVar2 = 0;
  if (pTask->pUnpacked == (UnpackedRecord *)0x0) {
    pUVar1 = sqlite3VdbeAllocUnpackedRecord(pTask->pSorter->pKeyInfo);
    pTask->pUnpacked = pUVar1;
    if (pUVar1 == (UnpackedRecord *)0x0) {
      iVar2 = 7;
    }
    else {
      pUVar1->nField = pTask->pSorter->pKeyInfo->nKeyField;
      pUVar1->errCode = '\0';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int vdbeSortAllocUnpacked(SortSubtask *pTask){
  if( pTask->pUnpacked==0 ){
    pTask->pUnpacked = sqlite3VdbeAllocUnpackedRecord(pTask->pSorter->pKeyInfo);
    if( pTask->pUnpacked==0 ) return SQLITE_NOMEM_BKPT;
    pTask->pUnpacked->nField = pTask->pSorter->pKeyInfo->nKeyField;
    pTask->pUnpacked->errCode = 0;
  }
  return SQLITE_OK;
}